

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O3

void printImmScale(MCInst *MI,uint OpNum,SStream *O,int Scale)

{
  byte bVar1;
  cs_struct *h;
  cs_detail *pcVar2;
  uint id;
  MCOperand *op;
  int64_t iVar3;
  uint8_t *puVar4;
  uint8_t uVar5;
  long val;
  
  op = MCInst_getOperand(MI,OpNum);
  iVar3 = MCOperand_getImm(op);
  val = iVar3 * (ulong)(uint)Scale;
  printInt64Bang(O,val);
  h = MI->csh;
  if (h->detail != CS_OPT_OFF) {
    if (h->doing_mem == true) {
      pcVar2 = MI->flat_insn->detail;
      *(int *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + 0x3d) = (int)val;
    }
    else {
      id = MCInst_getOpcode(MI);
      bVar1 = MI->ac_idx;
      puVar4 = AArch64_get_op_access(h,id);
      uVar5 = '\0';
      if (puVar4[bVar1] != 0x80) {
        uVar5 = puVar4[bVar1];
      }
      pcVar2 = MI->flat_insn->detail;
      pcVar2->groups[(ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar5;
      MI->ac_idx = MI->ac_idx + '\x01';
      pcVar2 = MI->flat_insn->detail;
      puVar4 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + 0x2d;
      puVar4[0] = '\x02';
      puVar4[1] = '\0';
      puVar4[2] = '\0';
      puVar4[3] = '\0';
      pcVar2 = MI->flat_insn->detail;
      *(long *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + 0x35) = val;
      puVar4 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar4 = *puVar4 + '\x01';
    }
  }
  return;
}

Assistant:

static void printImmScale(MCInst *MI, unsigned OpNum, SStream *O, int Scale)
{
	int64_t val = Scale * MCOperand_getImm(MCInst_getOperand(MI, OpNum));

	printInt64Bang(O, val);

	if (MI->csh->detail) {
		if (MI->csh->doing_mem) {
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].mem.disp = (int32_t)val;
		} else {
#ifndef CAPSTONE_DIET
			uint8_t access;
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = val;
			MI->flat_insn->detail->arm64.op_count++;
		}
	}
}